

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O0

size_t __thiscall embree::SceneGraph::PlyParser::loadInteger(PlyParser *this,Tag ty)

{
  char cVar1;
  byte bVar2;
  short sVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  runtime_error *this_00;
  undefined4 in_ESI;
  PlyParser *in_RDI;
  ulong local_8;
  
  switch(in_ESI) {
  case 0:
    cVar1 = read_char(in_RDI);
    local_8 = (ulong)cVar1;
    break;
  case 1:
    bVar2 = read_uchar(in_RDI);
    local_8 = (ulong)bVar2;
    break;
  case 2:
    sVar3 = read_short(in_RDI);
    local_8 = (ulong)sVar3;
    break;
  case 3:
    uVar4 = read_ushort(in_RDI);
    local_8 = (ulong)uVar4;
    break;
  case 4:
    iVar5 = read_int(in_RDI);
    local_8 = (ulong)iVar5;
    break;
  case 5:
    uVar6 = read_uint(in_RDI);
    local_8 = (ulong)uVar6;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_8;
}

Assistant:

size_t loadInteger(Type::Tag ty)
      {
        switch (ty) {
        case Type::PTY_CHAR   : return read_char(); break;
        case Type::PTY_UCHAR  : return read_uchar(); break;
        case Type::PTY_SHORT  : return read_short(); break;
        case Type::PTY_USHORT : return read_ushort(); break;
        case Type::PTY_INT    : return read_int(); break;
        case Type::PTY_UINT   : return read_uint(); break;
        default : throw std::runtime_error("invalid type"); return 0;
        }
      }